

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O0

MPI_Datatype mxx::datatype_builder<std::pair<unsigned_long,_unsigned_long>_>::get_type(void)

{
  int aiVar1 [2];
  undefined8 local_70;
  MPI_Datatype struct_type;
  MPI_Datatype types [2];
  long local_50;
  MPI_Aint t2_adr;
  MPI_Aint t1_adr;
  MPI_Aint p_adr;
  pair<unsigned_long,_unsigned_long> p;
  MPI_Aint displs [2];
  int blocklen [2];
  MPI_Datatype _type;
  
  displs[1] = 0x100000001;
  memset(&p.second,0,0x10);
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)&p_adr);
  MPI_Get_address(&p_adr,&t1_adr);
  MPI_Get_address(&p_adr,&t2_adr);
  MPI_Get_address(&p,&local_50);
  p.second = t2_adr - t1_adr;
  displs[0] = local_50 - t1_adr;
  struct_type = datatype_builder<unsigned_long>::get_type();
  types[0] = datatype_builder<unsigned_long>::get_type();
  if (displs[0] < (long)p.second) {
    std::swap<long>((long *)&p.second,displs);
    std::swap<ompi_datatype_t*>(&struct_type,types);
  }
  MPI_Type_create_struct(2,displs + 1,&p.second,&struct_type,&local_70);
  MPI_Type_create_resized(local_70,0,0x10,blocklen);
  MPI_Type_commit(blocklen);
  MPI_Type_free(&local_70);
  aiVar1[0] = blocklen[0];
  aiVar1[1] = blocklen[1];
  return (MPI_Datatype)aiVar1;
}

Assistant:

static MPI_Datatype get_type() {
        MPI_Datatype _type;

        int blocklen[2] = {1, 1};
        MPI_Aint displs[2] = {0,0};
        // get actual displacement (in case of padding in the structure)
        std::pair<T1, T2> p;
        MPI_Aint p_adr, t1_adr, t2_adr;
        MPI_Get_address(&p, &p_adr);
        MPI_Get_address(&p.first, &t1_adr);
        MPI_Get_address(&p.second, &t2_adr);
        displs[0] = t1_adr - p_adr;
        displs[1] = t2_adr - p_adr;

        // create type
        // TODO: use cached type!
        MPI_Datatype types[2] = {datatype_builder<T1>::get_type(), datatype_builder<T2>::get_type()};
        // in case elements are represented the opposite way around in
        // the pair (gcc does so), then swap them
        if (displs[0] > displs[1]) {
            std::swap(displs[0], displs[1]);
            std::swap(types[0], types[1]);
        }
        // create MPI_Datatype (resized to actual sizeof())
        MPI_Datatype struct_type;
        MPI_Type_create_struct(2, blocklen, displs, types, &struct_type);
        MPI_Type_create_resized(struct_type, 0, sizeof(p), &_type);
        MPI_Type_commit(&_type);
        MPI_Type_free(&struct_type);
        return _type;
    }